

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

size_t Output::VPrint(char16 *form,__va_list_tag *argptr)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  WCHAR local_1018 [4];
  char16 buf [2048];
  
  iVar1 = _vsnwprintf_unsafe(local_1018,0x800,0xffffffffffffffff,form,argptr);
  iVar3 = 0x7ff;
  if (iVar1 != -1) {
    iVar3 = iVar1;
  }
  sVar2 = PrintBuffer(local_1018,(long)iVar3);
  return sVar2;
}

Assistant:

size_t __cdecl
Output::VPrint(const char16 *form, va_list argptr)
{
    char16 buf[2048];
    size_t size;

    size = _vsnwprintf_s(buf, _countof(buf), _TRUNCATE, form, argptr);
    if(size == -1)
    {
        size = _countof(buf) - 1;  // characters written, excluding the terminating null
    }
    return Output::PrintBuffer(buf, size);
}